

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  long lVar1;
  st_ptls_aead_context_t *psVar2;
  uint64_t uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint8_t aad [5];
  uint8_t local_2e;
  undefined2 local_2d;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  psVar2 = ctx->aead;
  lVar1 = inlen + 1 + psVar2->algo->tag_size;
  local_2d = 0x317;
  local_2b = 3;
  local_2a = (undefined1)((ulong)lVar1 >> 8);
  local_29 = (undefined1)lVar1;
  uVar3 = ctx->seq;
  ctx->seq = uVar3 + 1;
  local_2e = content_type;
  (*psVar2->do_encrypt_init)(psVar2,uVar3,&local_2d,5);
  sVar4 = (*ctx->aead->do_encrypt_update)(ctx->aead,output,input,inlen);
  sVar5 = (*ctx->aead->do_encrypt_update)(ctx->aead,(void *)((long)output + sVar4),&local_2e,1);
  sVar6 = (*ctx->aead->do_encrypt_final)(ctx->aead,(void *)((long)output + sVar5 + sVar4));
  return sVar6 + sVar5 + sVar4;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    uint8_t aad[5];
    size_t off = 0;

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_init(ctx->aead, ctx->seq++, aad, sizeof(aad));
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, &content_type, 1);
    off += ptls_aead_encrypt_final(ctx->aead, ((uint8_t *)output) + off);

    return off;
}